

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

uint __thiscall
wasm::Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
          (Visitor<wasm::CostAnalyzer,_unsigned_int> *this,Expression *curr)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  CostType CVar4;
  int iVar5;
  Expression *pEVar6;
  
  iVar5 = 1;
LAB_00943c2c:
  if ((ResumeThrow *)curr == (ResumeThrow *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::CostAnalyzer, unsigned int>::visit(Expression *) [SubType = wasm::CostAnalyzer, ReturnType = unsigned int]"
                 );
  }
  CVar4 = 0;
  switch((((ResumeThrow *)curr)->super_SpecificExpression<(wasm::Expression::Id)94>).
         super_Expression._id) {
  case BlockId:
    CVar4 = CostAnalyzer::visitBlock((CostAnalyzer *)this,(Block *)curr);
    goto switchD_00943c4b_caseD_8;
  case IfId:
    CVar4 = CostAnalyzer::visitIf((CostAnalyzer *)this,(If *)curr);
    goto switchD_00943c4b_caseD_8;
  case LoopId:
    curr = (Expression *)
           (((ResumeThrow *)curr)->handlerTags).
           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    iVar5 = iVar5 * 5;
    goto LAB_00943c2c;
  case BreakId:
    CVar4 = CostAnalyzer::visitBreak((CostAnalyzer *)this,(Break *)curr);
    goto switchD_00943c4b_caseD_8;
  case SwitchId:
    CVar4 = CostAnalyzer::visitSwitch((CostAnalyzer *)this,(Switch *)curr);
    goto switchD_00943c4b_caseD_8;
  case CallId:
    CVar4 = CostAnalyzer::visitCall((CostAnalyzer *)this,(Call *)curr);
    goto switchD_00943c4b_caseD_8;
  case CallIndirectId:
    CVar4 = CostAnalyzer::visitCallIndirect((CostAnalyzer *)this,(CallIndirect *)curr);
  case LocalGetId:
  case NopId:
  case UnreachableId:
  case PopId:
    goto switchD_00943c4b_caseD_8;
  case LocalSetId:
  case SIMDExtractId:
  case RefAsId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str;
    break;
  case GlobalGetId:
  case ConstId:
  case MemorySizeId:
  case RefNullId:
  case RefFuncId:
  case TableSizeId:
    CVar4 = 1;
    goto switchD_00943c4b_caseD_8;
  case GlobalSetId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    goto LAB_00943e26;
  case LoadId:
    uVar3 = visit(this,(Expression *)
                       (((ResumeThrow *)curr)->handlerTags).
                       super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements)
    ;
    bVar1 = (byte)(((ResumeThrow *)curr)->handlerTags).
                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    CVar4 = uVar3 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 + 1;
    goto switchD_00943c4b_caseD_8;
  case StoreId:
    CVar4 = CostAnalyzer::visitStore((CostAnalyzer *)this,(Store *)curr);
    goto switchD_00943c4b_caseD_8;
  case UnaryId:
    CVar4 = CostAnalyzer::visitUnary((CostAnalyzer *)this,(Unary *)curr);
    goto switchD_00943c4b_caseD_8;
  case BinaryId:
    CVar4 = CostAnalyzer::visitBinary((CostAnalyzer *)this,(Binary *)curr);
    goto switchD_00943c4b_caseD_8;
  case SelectId:
    CVar4 = CostAnalyzer::visitSelect((CostAnalyzer *)this,(Select *)curr);
    goto switchD_00943c4b_caseD_8;
  case DropId:
  case TryTableId:
  case TupleExtractId:
    curr = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    goto LAB_00943c2c;
  case ReturnId:
    goto switchD_00943c4b_caseD_13;
  case MemoryGrowId:
    uVar3 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar4 = uVar3 + 0x14;
    goto switchD_00943c4b_caseD_8;
  case AtomicRMWId:
    CVar4 = CostAnalyzer::visitAtomicRMW((CostAnalyzer *)this,(AtomicRMW *)curr);
    goto switchD_00943c4b_caseD_8;
  case AtomicCmpxchgId:
    CVar4 = CostAnalyzer::visitAtomicCmpxchg((CostAnalyzer *)this,(AtomicCmpxchg *)curr);
    goto switchD_00943c4b_caseD_8;
  case AtomicWaitId:
    CVar4 = CostAnalyzer::visitAtomicWait((CostAnalyzer *)this,(AtomicWait *)curr);
    goto switchD_00943c4b_caseD_8;
  case AtomicNotifyId:
    CVar4 = CostAnalyzer::visitAtomicNotify((CostAnalyzer *)this,(AtomicNotify *)curr);
    goto switchD_00943c4b_caseD_8;
  case AtomicFenceId:
  case RethrowId:
  case ThrowRefId:
    CVar4 = 10;
    goto switchD_00943c4b_caseD_8;
  case SIMDReplaceId:
    CVar4 = CostAnalyzer::visitSIMDReplace((CostAnalyzer *)this,(SIMDReplace *)curr);
    goto switchD_00943c4b_caseD_8;
  case SIMDShuffleId:
    CVar4 = CostAnalyzer::visitSIMDShuffle((CostAnalyzer *)this,(SIMDShuffle *)curr);
    goto switchD_00943c4b_caseD_8;
  case SIMDTernaryId:
    CVar4 = CostAnalyzer::visitSIMDTernary((CostAnalyzer *)this,(SIMDTernary *)curr);
    goto switchD_00943c4b_caseD_8;
  case SIMDShiftId:
    CVar4 = CostAnalyzer::visitSIMDShift((CostAnalyzer *)this,(SIMDShift *)curr);
    goto switchD_00943c4b_caseD_8;
  case SIMDLoadId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    break;
  case SIMDLoadStoreLaneId:
    CVar4 = CostAnalyzer::visitSIMDLoadStoreLane((CostAnalyzer *)this,(SIMDLoadStoreLane *)curr);
    goto switchD_00943c4b_caseD_8;
  case MemoryInitId:
    CVar4 = CostAnalyzer::visitMemoryInit((CostAnalyzer *)this,(MemoryInit *)curr);
    goto switchD_00943c4b_caseD_8;
  case DataDropId:
    CVar4 = 5;
    goto switchD_00943c4b_caseD_8;
  case MemoryCopyId:
    CVar4 = CostAnalyzer::visitMemoryCopy((CostAnalyzer *)this,(MemoryCopy *)curr);
    goto switchD_00943c4b_caseD_8;
  case MemoryFillId:
    CVar4 = CostAnalyzer::visitMemoryFill((CostAnalyzer *)this,(MemoryFill *)curr);
    goto switchD_00943c4b_caseD_8;
  case RefIsNullId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    break;
  case RefEqId:
    CVar4 = CostAnalyzer::visitRefEq((CostAnalyzer *)this,(RefEq *)curr);
    goto switchD_00943c4b_caseD_8;
  case TableGetId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    break;
  case TableSetId:
    CVar4 = CostAnalyzer::visitTableSet((CostAnalyzer *)this,(TableSet *)curr);
    goto switchD_00943c4b_caseD_8;
  case TableGrowId:
    CVar4 = CostAnalyzer::visitTableGrow((CostAnalyzer *)this,(TableGrow *)curr);
    goto switchD_00943c4b_caseD_8;
  case TableFillId:
    CVar4 = CostAnalyzer::visitTableFill((CostAnalyzer *)this,(TableFill *)curr);
    goto switchD_00943c4b_caseD_8;
  case TableCopyId:
    CVar4 = CostAnalyzer::visitTableCopy((CostAnalyzer *)this,(TableCopy *)curr);
    goto switchD_00943c4b_caseD_8;
  case TableInitId:
    CVar4 = CostAnalyzer::visitTableInit((CostAnalyzer *)this,(TableInit *)curr);
    goto switchD_00943c4b_caseD_8;
  case TryId:
    curr = (Expression *)
           (((ResumeThrow *)curr)->handlerTags).
           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    goto LAB_00943c2c;
  case ThrowId:
    CVar4 = CostAnalyzer::visitThrow((CostAnalyzer *)this,(Throw *)curr);
    goto switchD_00943c4b_caseD_8;
  case TupleMakeId:
    CVar4 = CostAnalyzer::visitTupleMake((CostAnalyzer *)this,(TupleMake *)curr);
    goto switchD_00943c4b_caseD_8;
  case RefI31Id:
    uVar3 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar4 = uVar3 + 3;
    goto switchD_00943c4b_caseD_8;
  case I31GetId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
LAB_00943e26:
    uVar3 = visit(this,pEVar6);
    CVar4 = uVar3 + 2;
    goto switchD_00943c4b_caseD_8;
  case CallRefId:
    CVar4 = CostAnalyzer::visitCallRef((CostAnalyzer *)this,(CallRef *)curr);
    goto switchD_00943c4b_caseD_8;
  case RefTestId:
  case RefCastId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    uVar2 = (pEVar6->type).id;
    uVar3 = visit(this,pEVar6);
    CVar4 = uVar3 + (((uint)uVar2 & 3) == 2 && 6 < uVar2) + 5;
    goto switchD_00943c4b_caseD_8;
  case BrOnId:
    CVar4 = CostAnalyzer::visitBrOn((CostAnalyzer *)this,(BrOn *)curr);
    goto switchD_00943c4b_caseD_8;
  case StructNewId:
    CVar4 = CostAnalyzer::visitStructNew((CostAnalyzer *)this,(StructNew *)curr);
    goto switchD_00943c4b_caseD_8;
  case StructGetId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str;
    goto LAB_00943faf;
  case StructSetId:
    CVar4 = CostAnalyzer::visitStructSet((CostAnalyzer *)this,(StructSet *)curr);
    goto switchD_00943c4b_caseD_8;
  case StructRMWId:
    CVar4 = CostAnalyzer::visitStructRMW((CostAnalyzer *)this,(StructRMW *)curr);
    goto switchD_00943c4b_caseD_8;
  case StructCmpxchgId:
    CVar4 = CostAnalyzer::visitStructCmpxchg((CostAnalyzer *)this,(StructCmpxchg *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayNewId:
    CVar4 = CostAnalyzer::visitArrayNew((CostAnalyzer *)this,(ArrayNew *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayNewDataId:
    CVar4 = CostAnalyzer::visitArrayNewData((CostAnalyzer *)this,(ArrayNewData *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayNewElemId:
    CVar4 = CostAnalyzer::visitArrayNewElem((CostAnalyzer *)this,(ArrayNewElem *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayNewFixedId:
    CVar4 = CostAnalyzer::visitArrayNewFixed((CostAnalyzer *)this,(ArrayNewFixed *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayGetId:
    CVar4 = CostAnalyzer::visitArrayGet((CostAnalyzer *)this,(ArrayGet *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArraySetId:
    CVar4 = CostAnalyzer::visitArraySet((CostAnalyzer *)this,(ArraySet *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayLenId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
LAB_00943faf:
    uVar2 = (pEVar6->type).id;
    uVar3 = visit(this,pEVar6);
    CVar4 = uVar3 + (((uint)uVar2 & 3) == 2 && 6 < uVar2) + 1;
    goto switchD_00943c4b_caseD_8;
  case ArrayCopyId:
    CVar4 = CostAnalyzer::visitArrayCopy((CostAnalyzer *)this,(ArrayCopy *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayFillId:
    CVar4 = CostAnalyzer::visitArrayFill((CostAnalyzer *)this,(ArrayFill *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayInitDataId:
    CVar4 = CostAnalyzer::visitArrayInitData((CostAnalyzer *)this,(ArrayInitData *)curr);
    goto switchD_00943c4b_caseD_8;
  case ArrayInitElemId:
    CVar4 = CostAnalyzer::visitArrayInitElem((CostAnalyzer *)this,(ArrayInitElem *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringNewId:
    CVar4 = CostAnalyzer::visitStringNew((CostAnalyzer *)this,(StringNew *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringConstId:
    CVar4 = 4;
    goto switchD_00943c4b_caseD_8;
  case StringMeasureId:
    uVar3 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str);
    CVar4 = uVar3 + 6;
    goto switchD_00943c4b_caseD_8;
  case StringEncodeId:
    CVar4 = CostAnalyzer::visitStringEncode((CostAnalyzer *)this,(StringEncode *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringConcatId:
    CVar4 = CostAnalyzer::visitStringConcat((CostAnalyzer *)this,(StringConcat *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringEqId:
    CVar4 = CostAnalyzer::visitStringEq((CostAnalyzer *)this,(StringEq *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringWTF16GetId:
    CVar4 = CostAnalyzer::visitStringWTF16Get((CostAnalyzer *)this,(StringWTF16Get *)curr);
    goto switchD_00943c4b_caseD_8;
  case StringSliceWTFId:
    CVar4 = CostAnalyzer::visitStringSliceWTF((CostAnalyzer *)this,(StringSliceWTF *)curr);
    goto switchD_00943c4b_caseD_8;
  case ContNewId:
    uVar3 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar4 = uVar3 + 0x6e;
    goto switchD_00943c4b_caseD_8;
  case ContBindId:
    CVar4 = CostAnalyzer::visitContBind((CostAnalyzer *)this,(ContBind *)curr);
    goto switchD_00943c4b_caseD_8;
  case SuspendId:
    CVar4 = CostAnalyzer::visitSuspend((CostAnalyzer *)this,(Suspend *)curr);
    goto switchD_00943c4b_caseD_8;
  case ResumeId:
    CVar4 = CostAnalyzer::visitResume((CostAnalyzer *)this,(Resume *)curr);
    goto switchD_00943c4b_caseD_8;
  case ResumeThrowId:
    CVar4 = CostAnalyzer::visitResumeThrow((CostAnalyzer *)this,(ResumeThrow *)curr);
    goto switchD_00943c4b_caseD_8;
  case StackSwitchId:
    CVar4 = CostAnalyzer::visitStackSwitch((CostAnalyzer *)this,(StackSwitch *)curr);
    goto switchD_00943c4b_caseD_8;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                       ,0x46);
  }
  uVar3 = visit(this,pEVar6);
  CVar4 = uVar3 + 1;
  goto switchD_00943c4b_caseD_8;
switchD_00943c4b_caseD_13:
  curr = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
  CVar4 = 0;
  if ((ResumeThrow *)curr == (ResumeThrow *)0x0) {
switchD_00943c4b_caseD_8:
    return iVar5 * CVar4;
  }
  goto LAB_00943c2c;
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }